

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::IntToDescriptor
          (ChMatterMeshless *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ChVectorRef local_48;
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    uVar6 = 0;
    uVar8 = off_v;
    do {
      uVar4 = (ulong)((int)uVar6 * 3 + off_v);
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)uVar4) goto LAB_006154f6;
      pdVar1 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      ChVariables::Get_qb(&local_48,
                          &((psVar2[uVar6].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 3) goto LAB_00615515;
      uVar3 = 3;
      if ((local_48.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_ & 7) == 0) {
        uVar5 = -((uint)((ulong)local_48.
                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                ._0_8_ >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 3) {
          uVar3 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_006153e2;
        uVar3 = 0;
LAB_00615406:
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar3 * 8) = pdVar1[uVar8 + uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar3 != 3);
      }
      else {
LAB_006153e2:
        uVar7 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar7 * 8) = pdVar1[uVar8 + uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
        if ((int)uVar3 != 3) goto LAB_00615406;
      }
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < (long)uVar4) {
LAB_006154f6:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      ChVariables::Get_fb(&local_48,
                          &(((this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar6].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 3) {
LAB_00615515:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      uVar4 = 3;
      if ((local_48.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_ & 7) == 0) {
        uVar5 = -((uint)((ulong)local_48.
                                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                ._0_8_ >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 3) {
          uVar4 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_00615481;
        uVar4 = 0;
LAB_006154a5:
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar4 * 8) = pdVar1[uVar8 + uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      else {
LAB_00615481:
        uVar3 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar3 * 8) = pdVar1[uVar8 + uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
        if ((int)uVar4 != 3) goto LAB_006154a5;
      }
      psVar2 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar8 = uVar8 + 3;
    } while (uVar6 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  return;
}

Assistant:

void ChMatterMeshless::IntToDescriptor(const unsigned int off_v,
                                       const ChStateDelta& v,
                                       const ChVectorDynamic<>& R,
                                       const unsigned int off_L,
                                       const ChVectorDynamic<>& L,
                                       const ChVectorDynamic<>& Qc) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->variables.Get_qb() = v.segment(off_v + 3 * j, 3);
        nodes[j]->variables.Get_fb() = R.segment(off_v + 3 * j, 3);
    }
}